

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::php::(anonymous_namespace)::ConstantNamePrefix_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view classname)

{
  Nonnull<char_*> __s1;
  php *__n;
  bool bVar1;
  int iVar2;
  char *extraout_RDX;
  long lVar3;
  size_type __rlen;
  string_view name;
  string lower;
  Nonnull<char_*> local_50;
  php *local_48;
  char local_40;
  undefined7 uStack_3f;
  
  local_50 = &local_40;
  local_48 = (php *)0x0;
  local_40 = '\0';
  std::__cxx11::string::resize((ulong)&local_50,(char)this);
  absl::lts_20250127::ascii_internal::AsciiStrToLower
            (local_50,(Nullable<const_char_*>)classname._M_len,(size_t)this);
  name._M_str = extraout_RDX;
  name._M_len = (size_t)local_50;
  bVar1 = IsReservedName(local_48,name);
  __n = local_48;
  __s1 = local_50;
  lVar3 = 8;
  do {
    if (__n == *(php **)((long)&PTR_typeinfo_0196e578 + lVar3)) {
      if (__n == (php *)0x0) goto LAB_00e3cf36;
      iVar2 = bcmp(__s1,*(void **)((long)&kValidConstantNames[0]._M_len + lVar3),(size_t)__n);
      if (iVar2 == 0) goto LAB_00e3cf36;
    }
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 200);
  if (bVar1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"PB","");
  }
  else {
LAB_00e3cf36:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,anon_var_dwarf_a12c75 + 5);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ConstantNamePrefix(absl::string_view classname) {
  bool is_reserved = false;

  std::string lower = absl::AsciiStrToLower(classname);

  is_reserved = IsReservedName(lower);

  for (int i = 0; i < kValidConstantNamesSize; i++) {
    if (lower == kValidConstantNames[i]) {
      is_reserved = false;
      break;
    }
  }

  if (is_reserved) {
    return "PB";
  }

  return "";
}